

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O2

bool __thiscall tcmalloc::PageHeap::CheckState(PageHeap *this)

{
  PageMap *this_00;
  uint __line;
  bool bVar1;
  Span *pSVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  _Base_ptr p_Var6;
  Span *pSVar7;
  uint64_t uVar8;
  char *__assertion;
  int iVar9;
  uint64_t uVar10;
  uint64_t local_60;
  uint64_t local_50;
  
  std::mutex::lock(&this->lock);
  if (this->release_rate_ < 0) {
    __assertion = "0 <= release_rate_";
    __line = 0x5c;
  }
  else if (this->release_index_ < 0x81) {
    if ((this->stat).returned_bytes + (this->stat).normal_bytes + (this->stat).in_used_bytes ==
        (this->stat).system_bytes) {
      bVar1 = CheckSmallList(this);
      if (bVar1) {
        this_00 = &this->page_map_;
        uVar8 = 0;
        local_50 = 0;
        for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
          iVar9 = (int)this->small_normal_size_[lVar3];
          pSVar7 = this->small_normal_ + lVar3;
          while (pSVar7 = pSVar7->next, pSVar7 != this->small_normal_ + lVar3) {
            if (iVar9 < 1) {
              __assertion = "count >= 0";
              __line = 0x6a;
              goto LAB_001084e5;
            }
            if (pSVar7->location != 1) {
              __assertion = "span->location == Span::IN_NORMAL";
              __line = 0x6b;
              goto LAB_001084e5;
            }
            pSVar2 = (Span *)PageMap::Get(this_00,pSVar7->page_id);
            if (pSVar2 != pSVar7) {
              __assertion = "page_map_.Get(span->page_id) == span";
              __line = 0x6c;
              goto LAB_001084e5;
            }
            pSVar2 = (Span *)PageMap::Get(this_00,(pSVar7->page_id + pSVar7->npages) - 1);
            if (pSVar2 != pSVar7) {
              __assertion = "page_map_.Get(span->page_id + span->npages - 1) == span";
              __line = 0x6d;
              goto LAB_001084e5;
            }
            uVar8 = uVar8 + pSVar7->npages * 0x2000;
            iVar9 = iVar9 + -1;
          }
          iVar9 = (int)this->small_returned_size_[lVar3];
          pSVar7 = this->small_returned_ + lVar3;
          while (pSVar7 = pSVar7->next, pSVar7 != this->small_returned_ + lVar3) {
            if (iVar9 < 1) {
              __assertion = "count >= 0";
              __line = 0x73;
              goto LAB_001084e5;
            }
            if (pSVar7->location != 2) {
              __assertion = "span->location == Span::IN_RETURNED";
              __line = 0x74;
              goto LAB_001084e5;
            }
            pSVar2 = (Span *)PageMap::Get(this_00,pSVar7->page_id);
            if (pSVar2 != pSVar7) {
              __assertion = "page_map_.Get(span->page_id) == span";
              __line = 0x75;
              goto LAB_001084e5;
            }
            pSVar2 = (Span *)PageMap::Get(this_00,(pSVar7->page_id + pSVar7->npages) - 1);
            if (pSVar2 != pSVar7) {
              __assertion = "page_map_.Get(span->page_id + span->npages - 1) == span";
              __line = 0x76;
              goto LAB_001084e5;
            }
            local_50 = local_50 + pSVar7->npages * 0x2000;
            iVar9 = iVar9 + -1;
          }
        }
        iVar9 = (int)(this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        p_Var6 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_60 = 0;
        while( true ) {
          if ((_Rb_tree_header *)p_Var6 == &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header
             ) {
            iVar9 = (int)(this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            p_Var6 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            uVar10 = 0;
            while( true ) {
              if ((_Rb_tree_header *)p_Var6 ==
                  &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header) {
                if (local_60 != (this->stat).large_normal_bytes) {
                  __assert_fail("large_normal_bytes == stat.large_normal_bytes",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                                ,0x90,"bool tcmalloc::PageHeap::CheckState()");
                }
                if (uVar10 != (this->stat).large_returned_bytes) {
                  __assert_fail("large_returned_bytes == stat.large_returned_bytes",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                                ,0x91,"bool tcmalloc::PageHeap::CheckState()");
                }
                if (uVar8 != (this->stat).normal_bytes) {
                  __assert_fail("normal_bytes == stat.normal_bytes",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                                ,0x92,"bool tcmalloc::PageHeap::CheckState()");
                }
                if (local_50 == (this->stat).returned_bytes) {
                  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
                  return true;
                }
                __assert_fail("returned_bytes == stat.returned_bytes",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                              ,0x93,"bool tcmalloc::PageHeap::CheckState()");
              }
              if (iVar9 < 1) {
                __assert_fail("count >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                              ,0x88,"bool tcmalloc::PageHeap::CheckState()");
              }
              if (*(long *)(*(long *)(p_Var6 + 1) + 0x40) != 2) {
                __assert_fail("(*it)->location == Span::IN_RETURNED",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                              ,0x89,"bool tcmalloc::PageHeap::CheckState()");
              }
              pvVar4 = PageMap::Get(this_00,*(uint64_t *)(*(long *)(p_Var6 + 1) + 0x10));
              pvVar5 = *(void **)(p_Var6 + 1);
              if (pvVar4 != pvVar5) {
                __assert_fail("page_map_.Get((*it)->page_id) == (*it)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                              ,0x8a,"bool tcmalloc::PageHeap::CheckState()");
              }
              pvVar5 = PageMap::Get(this_00,(*(long *)((long)pvVar5 + 0x10) +
                                            *(long *)((long)pvVar5 + 0x18)) - 1);
              if (pvVar5 != *(void **)(p_Var6 + 1)) break;
              lVar3 = *(long *)((long)*(void **)(p_Var6 + 1) + 0x18) * 0x2000;
              local_50 = local_50 + lVar3;
              uVar10 = uVar10 + lVar3;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
              iVar9 = iVar9 + -1;
            }
            __assert_fail("page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x8b,"bool tcmalloc::PageHeap::CheckState()");
          }
          if (iVar9 < 1) break;
          if (*(long *)(*(long *)(p_Var6 + 1) + 0x40) != 1) {
            __assertion = "(*it)->location == Span::IN_NORMAL";
            __line = 0x7f;
            goto LAB_001084e5;
          }
          pvVar4 = PageMap::Get(this_00,*(uint64_t *)(*(long *)(p_Var6 + 1) + 0x10));
          pvVar5 = *(void **)(p_Var6 + 1);
          if (pvVar4 != pvVar5) {
            __assert_fail("page_map_.Get((*it)->page_id) == (*it)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x80,"bool tcmalloc::PageHeap::CheckState()");
          }
          pvVar5 = PageMap::Get(this_00,(*(long *)((long)pvVar5 + 0x10) +
                                        *(long *)((long)pvVar5 + 0x18)) - 1);
          if (pvVar5 != *(void **)(p_Var6 + 1)) {
            __assert_fail("page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                          ,0x81,"bool tcmalloc::PageHeap::CheckState()");
          }
          lVar3 = *(long *)((long)*(void **)(p_Var6 + 1) + 0x18) * 0x2000;
          uVar8 = uVar8 + lVar3;
          local_60 = local_60 + lVar3;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          iVar9 = iVar9 + -1;
        }
        __assertion = "count >= 0";
        __line = 0x7e;
      }
      else {
        __assertion = "CheckSmallList()";
        __line = 0x5f;
      }
    }
    else {
      __assertion = 
      "(stat.normal_bytes + stat.returned_bytes + stat.in_used_bytes) == stat.system_bytes";
      __line = 0x5e;
    }
  }
  else {
    __assertion = "release_index_ <= 128";
    __line = 0x5d;
  }
LAB_001084e5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,__line,"bool tcmalloc::PageHeap::CheckState()");
}

Assistant:

bool CheckState() {
        std::lock_guard<std::mutex> guard(lock);
        assert(0 <= release_rate_);
        assert(release_index_ <= 128);
        assert((stat.normal_bytes + stat.returned_bytes + stat.in_used_bytes) == stat.system_bytes);
        assert(CheckSmallList());

        uint64_t normal_bytes = 0;
        uint64_t returned_bytes = 0;
        uint64_t large_normal_bytes = 0;
        uint64_t large_returned_bytes = 0;

        for (int i = 0; i <= spanSmallPages; ++i) {
            int count = small_normal_size_[i];
            for (Span* span = small_normal_[i].next; span != &small_normal_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_NORMAL);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                normal_bytes += span->npages * spanPageSize;
            }
            count = small_returned_size_[i];
            for (Span* span = small_returned_[i].next; span != &small_returned_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_RETURNED);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                returned_bytes += span->npages * spanPageSize;
            }
        }

        int count = large_normal_.size();
        for (auto it = large_normal_.begin(); it != large_normal_.end(); ++it) {
            count--;
            assert(count >= 0);
            assert((*it)->location == Span::IN_NORMAL);
            assert(page_map_.Get((*it)->page_id) == (*it));
            assert(page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it));
            normal_bytes += (*it)->npages * spanPageSize;
            large_normal_bytes += (*it)->npages * spanPageSize;
        }
        count = large_returned_.size();
        for (auto it = large_returned_.begin(); it != large_returned_.end(); ++it) {
            count--;
            assert(count >= 0);
            assert((*it)->location == Span::IN_RETURNED);
            assert(page_map_.Get((*it)->page_id) == (*it));
            assert(page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it));
            returned_bytes += (*it)->npages * spanPageSize;
            large_returned_bytes += (*it)->npages * spanPageSize;
        }

        assert(large_normal_bytes == stat.large_normal_bytes);
        assert(large_returned_bytes == stat.large_returned_bytes);
        assert(normal_bytes == stat.normal_bytes);
        assert(returned_bytes == stat.returned_bytes);

        return true;
    }